

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_name_match_unittest.cc
# Opt level: O1

void __thiscall
bssl::VerifyNameMatchRDNSorting_DuplicateTypes_Test::~VerifyNameMatchRDNSorting_DuplicateTypes_Test
          (VerifyNameMatchRDNSorting_DuplicateTypes_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(VerifyNameMatchRDNSorting, DuplicateTypes) {
  std::string a;
  ASSERT_TRUE(LoadTestData("ascii", "mixed", "rdn_dupetype_sorting_1", &a));
  std::string b;
  ASSERT_TRUE(LoadTestData("ascii", "mixed", "rdn_dupetype_sorting_2", &b));
  EXPECT_TRUE(
      VerifyNameMatch(SequenceValueFromString(a), SequenceValueFromString(b)));
  EXPECT_TRUE(
      VerifyNameMatch(SequenceValueFromString(b), SequenceValueFromString(a)));
}